

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QShape.cpp
# Opt level: O0

int __thiscall QShape::qt_metacall(QShape *this,Call _c,int _id,void **_a)

{
  uint in_EDX;
  int in_ESI;
  Call in_EDI;
  void **in_stack_00000040;
  int in_stack_00000048;
  Call in_stack_0000004c;
  QObject *in_stack_00000050;
  undefined4 local_18;
  undefined4 local_4;
  
  local_18 = QFrame::qt_metacall(in_EDI,in_ESI,(void **)(ulong)in_EDX);
  local_4 = local_18;
  if (-1 < local_18) {
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall(in_stack_00000050,in_stack_0000004c,in_stack_00000048,in_stack_00000040);
      local_18 = local_18 + -6;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

int QShape::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QFrame::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    
#ifndef QT_NO_PROPERTIES
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 6;
    }
#endif // QT_NO_PROPERTIES
    return _id;
}